

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O1

String * __thiscall
Json::valueToString_abi_cxx11_(String *__return_storage_ptr__,Json *this,LargestInt value)

{
  byte *pbVar1;
  byte *pbVar2;
  ulong uVar3;
  bool bVar4;
  UIntToStringBuffer buffer;
  allocator local_29;
  byte local_28 [22];
  byte abStack_12 [10];
  
  if ((long)this < 0) {
    pbVar1 = abStack_12 + 3;
    uVar3 = -(long)this;
    do {
      pbVar2 = pbVar1;
      pbVar2[-2] = (char)uVar3 + (char)(uVar3 / 10) * -10 | 0x30;
      bVar4 = 9 < uVar3;
      pbVar1 = pbVar2 + -1;
      uVar3 = uVar3 / 10;
    } while (bVar4);
    pbVar2[-3] = 0x2d;
    pbVar2 = pbVar2 + -3;
  }
  else {
    pbVar2 = abStack_12 + 2;
    do {
      pbVar2[-1] = (char)this + (char)(Json *)((ulong)this / 10) * -10 | 0x30;
      pbVar2 = pbVar2 + -1;
      bVar4 = (Json *)0x9 < this;
      this = (Json *)((ulong)this / 10);
    } while (bVar4);
  }
  abStack_12[2] = 0;
  if (local_28 <= pbVar2) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)pbVar2,&local_29);
    return __return_storage_ptr__;
  }
  __assert_fail("current >= buffer",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/external/jsoncpp/src/lib_json/json_writer.cpp"
                ,0x6a,"String Json::valueToString(LargestInt)");
}

Assistant:

String valueToString(LargestInt value) {
  UIntToStringBuffer buffer;
  char* current = buffer + sizeof(buffer);
  if (value == Value::minLargestInt) {
    uintToString(LargestUInt(Value::maxLargestInt) + 1, current);
    *--current = '-';
  } else if (value < 0) {
    uintToString(LargestUInt(-value), current);
    *--current = '-';
  } else {
    uintToString(LargestUInt(value), current);
  }
  assert(current >= buffer);
  return current;
}